

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::setTimeSpec(QDateTimeEdit *this,TimeSpec spec)

{
  TimeSpec TVar1;
  QDateTimeEditPrivate *this_00;
  QDebug *o;
  TimeSpec in_ESI;
  QDebug *in_RDI;
  long in_FS_OFFSET;
  QDateTimeEditPrivate *d;
  undefined4 in_stack_ffffffffffffff78;
  Initialization in_stack_ffffffffffffff7c;
  uint in_stack_ffffffffffffff80;
  TimeSpec value;
  undefined4 in_stack_ffffffffffffff90;
  QDebug *dbg;
  char *in_stack_ffffffffffffffc8;
  QDebug local_30;
  QDebug local_28;
  QDebug local_20;
  QTimeZone local_18;
  QTimeZone local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  dbg = in_RDI;
  this_00 = d_func((QDateTimeEdit *)0x55b174);
  value = in_ESI;
  TVar1 = QTimeZone::timeSpec((QTimeZone *)0x55b192);
  if (in_ESI != TVar1) {
    if (value == LocalTime) {
      QTimeZone::QTimeZone((QTimeZone *)(ulong)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      setTimeZone((QDateTimeEdit *)CONCAT44(value,in_stack_ffffffffffffff80),
                  (QTimeZone *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      QTimeZone::~QTimeZone(&local_18);
    }
    else if (value == UTC) {
      QTimeZone::QTimeZone
                ((QTimeZone *)CONCAT44(1,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7c);
      setTimeZone((QDateTimeEdit *)CONCAT44(value,in_stack_ffffffffffffff80),
                  (QTimeZone *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      QTimeZone::~QTimeZone(&local_10);
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_ESI,in_stack_ffffffffffffff90),(char *)in_RDI,value,
                 (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      QMessageLogger::warning();
      o = QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffffc8);
      QDebug::QDebug(&local_28,o);
      ::operator<<(dbg,value);
      QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffffc8);
      QDebug::~QDebug(&local_20);
      QDebug::~QDebug(&local_28);
      QDebug::~QDebug(&local_30);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEdit::setTimeSpec(Qt::TimeSpec spec)
{
    Q_D(QDateTimeEdit);
    if (spec != d->timeZone.timeSpec()) {
        switch (spec) {
        case Qt::UTC:
            setTimeZone(QTimeZone::UTC);
            break;
        case Qt::LocalTime:
            setTimeZone(QTimeZone::LocalTime);
            break;
        default:
            qWarning() << "Ignoring attempt to set time-spec" << spec
                       << "which needs ancillary data: see setTimeZone()";
            return;
        }
    }
}